

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O0

t_pvalue * __thiscall xemmai::t_context::f_variable(t_context *this,wstring_view a_name)

{
  size_t sVar1;
  bool bVar2;
  t_lambda *this_00;
  t_object *this_01;
  const_iterator pvVar3;
  pointer ppVar4;
  t_scope *ptVar5;
  t_svalue *ptVar6;
  t_pvalue *local_90;
  const_iterator local_70;
  size_t i_2;
  t_object *scope;
  size_t index;
  const_iterator i_1;
  size_t outer;
  _Self local_40;
  iterator i;
  t_code *code;
  t_lambda *lambda;
  t_context *this_local;
  wstring_view a_name_local;
  
  a_name_local._M_len = (size_t)a_name._M_str;
  this_local = (t_context *)a_name._M_len;
  this_00 = t_object::f_as<xemmai::t_lambda>(this->v_lambda);
  this_01 = t_slot::operator->(&this_00->v_code);
  i._M_node = (_Base_ptr)t_object::f_as<xemmai::t_code>(this_01);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
       ::find<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                 ((map<std::__cxx11::wstring,xemmai::t_code::t_variable,std::less<void>,std::allocator<std::pair<std::__cxx11::wstring_const,xemmai::t_code::t_variable>>>
                   *)&((t_code *)i._M_node)->v_variables,
                  (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
  outer = (size_t)std::
                  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
                  ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>_>
                         *)&i._M_node[3]._M_parent);
  bVar2 = std::operator==(&local_40,(_Self *)&outer);
  if (bVar2) {
    a_name_local._M_str = (wchar_t *)0x0;
  }
  else {
    i_1 = (const_iterator)0x0;
    index = (size_t)std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local
                              );
    while( true ) {
      pvVar3 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                         ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local);
      bVar2 = false;
      if ((const_iterator)index != pvVar3) {
        bVar2 = *(int *)index == 0x3a;
      }
      if (!bVar2) break;
      i_1 = (const_iterator)((long)i_1 + 1);
      index = index + 4;
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>
             ::operator->(&local_40);
    sVar1 = (ppVar4->second).v_index;
    if (i_1 == (const_iterator)0x0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_code::t_variable>_>
               ::operator->(&local_40);
      if (((ppVar4->second).v_shared & 1U) == 0) {
        local_90 = this->v_base;
      }
      else {
        ptVar5 = t_object::f_as<xemmai::t_scope>(this->v_scope);
        local_90 = (t_pvalue *)t_scope::f_entries(ptVar5);
      }
      a_name_local._M_str = (wchar_t *)(local_90 + sVar1);
    }
    else {
      i_2 = (size_t)t_slot::operator_cast_to_t_object_(&this_00->v_scope);
      for (local_70 = (const_iterator)0x1; local_70 < i_1;
          local_70 = (const_iterator)((long)local_70 + 1)) {
        ptVar5 = t_object::f_as<xemmai::t_scope>((t_object *)i_2);
        i_2 = (size_t)t_scope::f_outer(ptVar5);
      }
      ptVar5 = t_object::f_as<xemmai::t_scope>((t_object *)i_2);
      ptVar6 = t_scope::f_entries(ptVar5);
      a_name_local._M_str = (wchar_t *)(ptVar6 + sVar1);
    }
  }
  return (t_pvalue *)a_name_local._M_str;
}

Assistant:

const t_pvalue* t_context::f_variable(std::wstring_view a_name) const
{
	auto& lambda = v_lambda->f_as<t_lambda>();
	auto& code = lambda.v_code->f_as<t_code>();
	auto i = code.v_variables.find(a_name);
	if (i == code.v_variables.end()) return nullptr;
	size_t outer = 0;
	for (auto i = a_name.begin(); i != a_name.end() && *i == L':'; ++i) ++outer;
	size_t index = i->second.v_index;
	if (outer <= 0) return (i->second.v_shared ? reinterpret_cast<const t_pvalue*>(v_scope->f_as<t_scope>().f_entries()) : v_base) + index;
	t_object* scope = lambda.v_scope;
	for (size_t i = 1; i < outer; ++i) scope = scope->f_as<t_scope>().f_outer();
	return reinterpret_cast<const t_pvalue*>(scope->f_as<t_scope>().f_entries()) + index;
}